

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_test.cc
# Opt level: O2

void anon_unknown.dwarf_4e9173::CNNTest::RunMultiOutCNNTest
               (float **input,int image_width,int image_height,int in_stride,CNN_CONFIG *cnn_config,
               CNN_THREAD_DATA *thread_data,CNN_MULTI_OUT *output,float **expected,double tolerance)

{
  _Bool _Var1;
  int iVar2;
  Message *pMVar3;
  uint uVar4;
  size_t num;
  float *val;
  ulong uVar5;
  CNN_THREAD_DATA *pCVar6;
  ulong uVar7;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  SEARCH_METHODS *pSVar8;
  float *val_00;
  long lVar9;
  double dVar10;
  CNN_MULTI_OUT *expr2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff20;
  AssertionResult gtest_ar_;
  AssertHelper in_stack_ffffffffffffff38;
  AssertionResult gtest_ar;
  int *out_heights;
  ulong local_80;
  CNN_THREAD_DATA *local_78;
  int *not_used;
  int *out_widths;
  int local_60;
  int local_5c;
  int *local_58;
  float *local_50;
  long local_48;
  long local_40;
  double tolerance_local;
  
  local_80 = (ulong)(uint)output->num_outputs;
  local_58 = output->output_channels;
  num = (size_t)output->num_outputs;
  local_78 = thread_data;
  tolerance_local = tolerance;
  out_widths = (int *)aom_calloc(num,4);
  out_heights = (int *)aom_calloc(num,4);
  not_used = (int *)aom_calloc(num,4);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  testing::internal::CmpHelperNE<int*,decltype(nullptr)>
            ((internal *)&gtest_ar,"out_widths","nullptr",&out_widths,(void **)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pSVar8 = "";
    }
    else {
      pSVar8 = *(SEARCH_METHODS **)
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
               ,0x55,(char *)pSVar8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff20,(Message *)&gtest_ar_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    testing::internal::CmpHelperNE<int*,decltype(nullptr)>
              ((internal *)&gtest_ar,"out_heights","nullptr",&out_heights,(void **)&gtest_ar_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar8 = "";
      }
      else {
        pSVar8 = *(SEARCH_METHODS **)
                  gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff20,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                 ,0x56,(char *)pSVar8);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffff20,(Message *)&gtest_ar_);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      testing::internal::CmpHelperNE<int*,decltype(nullptr)>
                ((internal *)&gtest_ar,"not_used","nullptr",&not_used,(void **)&gtest_ar_);
      if (gtest_ar.success_ != false) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        av1_find_cnn_output_size
                  (image_width,image_height,cnn_config,out_widths,out_heights,not_used);
        pCVar6 = local_78;
        expr2 = output;
        _Var1 = av1_cnn_predict_c(input,image_width,image_height,in_stride,cnn_config,local_78,
                                  output);
        this = &gtest_ar_.message_;
        gtest_ar_.success_ = _Var1;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (_Var1) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(this);
          uVar5 = 0;
          iVar2 = (int)local_80;
          local_80 = local_80 & 0xffffffff;
          if (iVar2 < 1) {
            local_80 = uVar5;
          }
          lVar9 = 0;
          for (; uVar5 != local_80; uVar5 = uVar5 + 1) {
            local_50 = expected[uVar5];
            local_60 = local_58[uVar5];
            uVar4 = out_heights[uVar5] * out_widths[uVar5];
            gtest_ar_.success_ = false;
            gtest_ar_._1_7_ = 0;
            iVar2 = 0;
            uVar7 = 0;
            if (0 < (int)uVar4) {
              uVar7 = (ulong)uVar4;
            }
            local_5c = 0;
            if (0 < local_60) {
              local_5c = local_60;
            }
            lVar9 = (long)(int)lVar9;
            local_78 = (CNN_THREAD_DATA *)-uVar7;
            dVar10 = 0.0;
            uVar7 = 0;
            for (; iVar2 != local_5c; iVar2 = iVar2 + 1) {
              val_00 = output->output_buffer[lVar9];
              local_48 = (long)(int)uVar7;
              val = local_50 + local_48;
              local_40 = lVar9;
              for (pCVar6 = (CNN_THREAD_DATA *)0x0; local_78 != pCVar6;
                  pCVar6 = (CNN_THREAD_DATA *)((long)&pCVar6[-1].workers + 7)) {
                testing::internal::DoubleNearPredFormat
                          ((char *)in_stack_ffffffffffffff20._M_head_impl,(char *)expr2,
                           (char *)gtest_ar_._0_8_,
                           (double)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl,(double)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
                           (double)in_stack_ffffffffffffff38.data_);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&stack0xffffffffffffff20);
                  std::operator<<((ostream *)
                                  &((AssertHelperData *)in_stack_ffffffffffffff20._M_head_impl)->
                                   line," output ");
                  std::ostream::operator<<(in_stack_ffffffffffffff20._M_head_impl + 0x10,(int)uVar5)
                  ;
                  std::operator<<((ostream *)
                                  &((AssertHelperData *)in_stack_ffffffffffffff20._M_head_impl)->
                                   line," channel ");
                  std::ostream::operator<<(in_stack_ffffffffffffff20._M_head_impl + 0x10,iVar2);
                  std::operator<<((ostream *)(in_stack_ffffffffffffff20._M_head_impl + 0x10),
                                  " pixel ");
                  std::ostream::operator<<
                            (&((AssertHelperData *)in_stack_ffffffffffffff20._M_head_impl)->line,
                             (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 |
                                         uVar7 & 0xffffffff) % (long)(int)uVar4));
                  std::operator<<((ostream *)(in_stack_ffffffffffffff20._M_head_impl + 0x10),": ");
                  pMVar3 = testing::Message::operator<<((Message *)&stack0xffffffffffffff20,val);
                  pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [2])0xc31319);
                  pMVar3 = testing::Message::operator<<(pMVar3,val_00);
                  std::endl<char,std::char_traits<char>>
                            ((ostream *)
                             ((pMVar3->ss_)._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 0x10));
                  pSVar8 = "";
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl !=
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pSVar8 = *(SEARCH_METHODS **)
                              gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&stack0xffffffffffffff38,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                             ,0x6b,(char *)pSVar8);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&stack0xffffffffffffff38,pMVar3);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&stack0xffffffffffffff38);
                  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )in_stack_ffffffffffffff20._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)in_stack_ffffffffffffff20._M_head_impl + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                dVar10 = (double)((*val - *val_00) * (*val - *val_00)) + (double)gtest_ar_._0_8_;
                val_00 = val_00 + 1;
                uVar7 = (ulong)((int)uVar7 + 1);
                val = val + 1;
                gtest_ar_._0_8_ = dVar10;
              }
              lVar9 = local_40 + 1;
              uVar7 = local_48 - (long)pCVar6;
            }
            gtest_ar_._0_8_ = dVar10 / (double)(int)(uVar4 * local_60);
            testing::internal::CmpHelperLE<double,double>
                      ((internal *)&gtest_ar,"mse","tolerance",(double *)&gtest_ar_,&tolerance_local
                      );
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&stack0xffffffffffffff20);
              std::operator<<((ostream *)(in_stack_ffffffffffffff20._M_head_impl + 0x10)," output ")
              ;
              std::ostream::operator<<
                        (&((AssertHelperData *)in_stack_ffffffffffffff20._M_head_impl)->line,
                         (int)uVar5);
              std::endl<char,std::char_traits<char>>
                        ((ostream *)(in_stack_ffffffffffffff20._M_head_impl + 0x10));
              pSVar8 = "";
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl !=
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pSVar8 = *(SEARCH_METHODS **)
                          gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff38,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                         ,0x76,(char *)pSVar8);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffff38,
                         (Message *)&stack0xffffffffffffff20);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffff38);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )in_stack_ffffffffffffff20._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)in_stack_ffffffffffffff20._M_head_impl + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
          }
          aom_free(out_widths);
          aom_free(out_heights);
          aom_free(not_used);
          return;
        }
        testing::Message::Message((Message *)&stack0xffffffffffffff20);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "av1_cnn_predict_c(input, image_width, image_height, in_stride, cnn_config, thread_data, output)"
                   ,"false","true",(char *)pCVar6);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                   ,0x5c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff38,(Message *)&stack0xffffffffffffff20);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff38);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )in_stack_ffffffffffffff20._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)in_stack_ffffffffffffff20._M_head_impl + 8))();
        }
        goto LAB_0047abca;
      }
      testing::Message::Message((Message *)&gtest_ar_);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar8 = "";
      }
      else {
        pSVar8 = *(SEARCH_METHODS **)
                  gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff20,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                 ,0x57,(char *)pSVar8);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffff20,(Message *)&gtest_ar_);
    }
  }
  this = &gtest_ar.message_;
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff20);
  if (gtest_ar_._0_8_ != 0) {
    (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
  }
LAB_0047abca:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this);
  return;
}

Assistant:

static void RunMultiOutCNNTest(const float **input, int image_width,
                                 int image_height, int in_stride,
                                 const CNN_CONFIG *cnn_config,
                                 CNN_THREAD_DATA *thread_data,
                                 CNN_MULTI_OUT *output, const float **expected,
                                 double tolerance) {
    const int num_outputs = output->num_outputs;
    const int *output_chs = output->output_channels;

    int *out_widths = (int *)aom_calloc(num_outputs, sizeof(*out_widths));
    int *out_heights = (int *)aom_calloc(num_outputs, sizeof(*out_heights));
    int *not_used = (int *)aom_calloc(num_outputs, sizeof(*not_used));
    ASSERT_NE(out_widths, nullptr);
    ASSERT_NE(out_heights, nullptr);
    ASSERT_NE(not_used, nullptr);

    av1_find_cnn_output_size(image_width, image_height, cnn_config, out_widths,
                             out_heights, not_used);
    ASSERT_TRUE(av1_cnn_predict(input, image_width, image_height, in_stride,
                                cnn_config, thread_data, output));

    int channel_offset = 0;
    for (int output_idx = 0; output_idx < num_outputs; output_idx++) {
      const float *expected_out = expected[output_idx];
      const int curr_output_chs = output_chs[output_idx];
      const int out_size = out_widths[output_idx] * out_heights[output_idx];

      double mse = 0;
      int expected_ite = 0;
      for (int channel = 0; channel < curr_output_chs; ++channel) {
        const float *buf_out = output->output_buffer[channel_offset];

        for (int i = 0; i < out_size; ++i) {
          EXPECT_NEAR(expected_out[expected_ite], buf_out[i],
                      PIXELWISE_FLOAT_TOL)
              << " output " << output_idx << " channel " << channel << " pixel "
              << expected_ite % out_size << ": " << expected_out[expected_ite]
              << "/" << buf_out[i] << std::endl;
          mse += SQR(expected_out[expected_ite] - buf_out[i]);
          expected_ite++;
        }

        channel_offset++;
      }
      mse /= (out_size * curr_output_chs);
      EXPECT_LE(mse, tolerance) << " output " << output_idx << std::endl;
    }

    aom_free(out_widths);
    aom_free(out_heights);
    aom_free(not_used);
  }